

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

int SafeDecodeLiteralBlockSwitch(BrotliDecoderStateInternal *s)

{
  BrotliBitReader *br;
  byte bVar1;
  uint uVar2;
  uint32_t uVar3;
  ulong uVar4;
  byte *pbVar5;
  size_t sVar6;
  byte *pbVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  size_t sVar12;
  HuffmanCode *pHVar13;
  int iVar14;
  uint32_t uVar15;
  int iVar16;
  uint local_40;
  uint local_3c;
  HuffmanCode *local_38;
  
  uVar2 = s->num_block_types[0];
  pHVar13 = s->block_type_trees;
  local_38 = s->block_len_trees;
  br = &s->br;
  uVar4 = (s->br).val_;
  uVar3 = (s->br).bit_pos_;
  pbVar5 = (s->br).next_in;
  sVar6 = (s->br).avail_in;
  iVar10 = 0;
  iVar14 = -8;
  iVar16 = -0x32;
  uVar9 = uVar4;
  pbVar7 = pbVar5;
  sVar12 = sVar6;
  while( true ) {
    sVar12 = sVar12 - 1;
    if (0xe < uVar3 + iVar16) break;
    if (sVar12 == 0xffffffffffffffff) {
      iVar14 = SafeDecodeSymbol(pHVar13,br,&local_40);
      if (iVar14 == 0) {
        return 0;
      }
      goto LAB_001058dc;
    }
    (s->br).val_ = uVar9 >> 8;
    uVar9 = uVar9 >> 8 | (ulong)*pbVar7 << 0x38;
    (s->br).val_ = uVar9;
    (s->br).bit_pos_ = uVar3 + iVar14;
    (s->br).avail_in = sVar12;
    (s->br).next_in = pbVar7 + 1;
    iVar10 = iVar10 + 8;
    iVar14 = iVar14 + -8;
    iVar16 = iVar16 + -8;
    pbVar7 = pbVar7 + 1;
  }
  iVar14 = uVar3 - iVar10;
  uVar9 = uVar9 >> ((byte)iVar14 & 0x3f);
  pHVar13 = pHVar13 + (uVar9 & 0xff);
  uVar8 = (uint)pHVar13->bits;
  if (8 < uVar8) {
    iVar14 = (uVar3 - iVar10) + 8;
    pHVar13 = pHVar13 + (ulong)pHVar13->value +
                        (ulong)((uint)(uVar9 >> 8) & 0xffffff & kBitMask[pHVar13->bits - 8] & 0x7f);
    uVar8 = (uint)pHVar13->bits;
  }
  (s->br).bit_pos_ = uVar8 + iVar14;
  local_40 = (uint)pHVar13->value;
LAB_001058dc:
  if (s->substate_read_block_length == BROTLI_STATE_READ_BLOCK_LENGTH_NONE) {
    for (uVar8 = (s->br).bit_pos_ - 0x32; uVar8 < 0xf; uVar8 = uVar8 - 8) {
      sVar12 = (s->br).avail_in;
      if (sVar12 == 0) {
        iVar14 = SafeDecodeSymbol(local_38,br,&local_3c);
        if (iVar14 != 0) goto LAB_001059b6;
        goto LAB_00105a70;
      }
      uVar9 = (s->br).val_;
      pbVar7 = (s->br).next_in;
      (s->br).val_ = uVar9 >> 8;
      (s->br).val_ = (ulong)*pbVar7 << 0x38 | uVar9 >> 8;
      (s->br).bit_pos_ = uVar8 + 0x2a;
      (s->br).avail_in = sVar12 - 1;
      (s->br).next_in = pbVar7 + 1;
    }
    iVar14 = uVar8 + 0x32;
    uVar9 = br->val_ >> ((byte)iVar14 & 0x3f);
    local_38 = local_38 + (uVar9 & 0xff);
    uVar11 = (uint)local_38->bits;
    if (8 < uVar11) {
      iVar14 = uVar8 + 0x3a;
      local_38 = local_38 +
                 (ulong)local_38->value +
                 (ulong)((uint)(uVar9 >> 8) & 0xffffff & kBitMask[local_38->bits - 8] & 0x7f);
      uVar11 = (uint)local_38->bits;
    }
    (s->br).bit_pos_ = uVar11 + iVar14;
    local_3c = (uint)local_38->value;
  }
  else {
    local_3c = s->block_length_index;
  }
LAB_001059b6:
  bVar1 = kBlockLengthPrefixCode[local_3c].nbits;
  uVar15 = (s->br).bit_pos_;
  iVar14 = -uVar15;
  while( true ) {
    uVar15 = uVar15 - 8;
    if ((uint)bVar1 <= iVar14 + 0x40U) {
      uVar8 = kBitMask[(uint)bVar1];
      (s->br).bit_pos_ = (uint)bVar1 - iVar14;
      s->block_length[0] =
           (uint)kBlockLengthPrefixCode[local_3c].offset +
           ((uint)((s->br).val_ >> (-(char)iVar14 & 0x3fU)) & uVar8);
      s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;
      if (local_40 == 0) {
        local_40 = s->block_type_rb[0];
      }
      else if (local_40 == 1) {
        local_40 = s->block_type_rb[1] + 1;
      }
      else {
        local_40 = local_40 - 2;
      }
      uVar8 = 0;
      if (uVar2 <= local_40) {
        uVar8 = uVar2;
      }
      local_40 = local_40 - uVar8;
      s->block_type_rb[0] = s->block_type_rb[1];
      s->block_type_rb[1] = local_40;
      s->context_map_slice = s->context_map + local_40 * 0x40;
      s->trivial_literal_context =
           (uint)((s->trivial_literal_contexts[local_40 >> 5] >> (local_40 & 0x1f) & 1) != 0);
      s->literal_htree = (s->literal_hgroup).htrees[s->context_map[local_40 * 0x40]];
      bVar1 = s->context_modes[local_40];
      s->context_lookup1 = "" + kContextLookupOffsets[bVar1];
      s->context_lookup2 = "" + kContextLookupOffsets[(ulong)bVar1 + 1];
      return 1;
    }
    sVar12 = (s->br).avail_in;
    if (sVar12 == 0) break;
    uVar9 = (s->br).val_;
    pbVar7 = (s->br).next_in;
    (s->br).val_ = uVar9 >> 8;
    (s->br).val_ = (ulong)*pbVar7 << 0x38 | uVar9 >> 8;
    (s->br).bit_pos_ = uVar15;
    (s->br).avail_in = sVar12 - 1;
    (s->br).next_in = pbVar7 + 1;
    iVar14 = iVar14 + 8;
  }
  s->block_length_index = local_3c;
LAB_00105a70:
  s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;
  (s->br).val_ = uVar4;
  (s->br).bit_pos_ = uVar3;
  (s->br).next_in = pbVar5;
  (s->br).avail_in = sVar6;
  return 0;
}

Assistant:

static BROTLI_BOOL BROTLI_NOINLINE SafeDecodeLiteralBlockSwitch(
    BrotliDecoderState* s) {
  return DecodeLiteralBlockSwitchInternal(1, s);
}